

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O2

void __thiscall
duckdb::DuckTransaction::PushSequenceUsage
          (DuckTransaction *this,SequenceCatalogEntry *sequence,SequenceData *data)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int64_t iVar4;
  iterator iVar5;
  data_ptr_t pdVar6;
  UndoBufferReference undo_entry;
  
  ::std::mutex::lock(&this->sequence_lock);
  undo_entry.entry.ptr = (UndoBufferEntry *)sequence;
  iVar5 = ::std::
          _Hashtable<std::reference_wrapper<duckdb::SequenceCatalogEntry>,_std::pair<const_std::reference_wrapper<duckdb::SequenceCatalogEntry>,_std::reference_wrapper<duckdb::SequenceValue>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::SequenceCatalogEntry>,_std::reference_wrapper<duckdb::SequenceValue>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::SequenceCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SequenceCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->sequence_usage)._M_h,(key_type *)&undo_entry);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::SequenceCatalogEntry>,_std::reference_wrapper<duckdb::SequenceValue>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    UndoBuffer::CreateEntry(&undo_entry,&this->undo_buffer,SEQUENCE_VALUE,0x18);
    pdVar6 = UndoBufferReference::Ptr(&undo_entry);
    *(SequenceCatalogEntry **)pdVar6 = sequence;
    uVar2 = *(undefined4 *)((long)&data->usage_count + 4);
    iVar4 = data->counter;
    uVar3 = *(undefined4 *)((long)&data->counter + 4);
    *(int *)(pdVar6 + 8) = (int)data->usage_count;
    *(undefined4 *)(pdVar6 + 0xc) = uVar2;
    *(int *)(pdVar6 + 0x10) = (int)iVar4;
    *(undefined4 *)(pdVar6 + 0x14) = uVar3;
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::SequenceCatalogEntry>,std::pair<std::reference_wrapper<duckdb::SequenceCatalogEntry>const,std::reference_wrapper<duckdb::SequenceValue>>,std::allocator<std::pair<std::reference_wrapper<duckdb::SequenceCatalogEntry>const,std::reference_wrapper<duckdb::SequenceValue>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::SequenceCatalogEntry>,duckdb::ReferenceHashFunction<duckdb::SequenceCatalogEntry>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<duckdb::SequenceCatalogEntry&,duckdb::SequenceValue&>
              ((_Hashtable<std::reference_wrapper<duckdb::SequenceCatalogEntry>,std::pair<std::reference_wrapper<duckdb::SequenceCatalogEntry>const,std::reference_wrapper<duckdb::SequenceValue>>,std::allocator<std::pair<std::reference_wrapper<duckdb::SequenceCatalogEntry>const,std::reference_wrapper<duckdb::SequenceValue>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::SequenceCatalogEntry>,duckdb::ReferenceHashFunction<duckdb::SequenceCatalogEntry>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->sequence_usage,sequence,pdVar6);
    BufferHandle::~BufferHandle(&undo_entry.handle);
  }
  else {
    lVar1 = *(long *)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::SequenceCatalogEntry>,_std::reference_wrapper<duckdb::SequenceValue>_>,_true>
                            ._M_cur + 0x10);
    iVar4 = data->counter;
    *(uint64_t *)(lVar1 + 8) = data->usage_count;
    *(int64_t *)(lVar1 + 0x10) = iVar4;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->sequence_lock);
  return;
}

Assistant:

void DuckTransaction::PushSequenceUsage(SequenceCatalogEntry &sequence, const SequenceData &data) {
	lock_guard<mutex> l(sequence_lock);
	auto entry = sequence_usage.find(sequence);
	if (entry == sequence_usage.end()) {
		auto undo_entry = undo_buffer.CreateEntry(UndoFlags::SEQUENCE_VALUE, sizeof(SequenceValue));
		auto sequence_info = reinterpret_cast<SequenceValue *>(undo_entry.Ptr());
		sequence_info->entry = &sequence;
		sequence_info->usage_count = data.usage_count;
		sequence_info->counter = data.counter;
		sequence_usage.emplace(sequence, *sequence_info);
	} else {
		auto &sequence_info = entry->second.get();
		D_ASSERT(RefersToSameObject(*sequence_info.entry, sequence));
		sequence_info.usage_count = data.usage_count;
		sequence_info.counter = data.counter;
	}
}